

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTests.cpp
# Opt level: O1

void __thiscall
ModelTestFixture_testFindById_Test::TestBody(ModelTestFixture_testFindById_Test *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  Mock *rhs;
  char *message;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  Model<Mock> local_28;
  
  local_28.id = 0;
  local_28._12_4_ = 0;
  local_28._vptr_Model = (_func_int **)&PTR_save_00140028;
  if (Model<Mock>::objectList._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    iVar2 = 1;
  }
  else {
    lVar3 = std::_Rb_tree_decrement
                      (&Model<Mock>::objectList._M_t._M_impl.super__Rb_tree_header._M_header);
    iVar2 = *(int *)(lVar3 + 0x30) + 1;
  }
  local_28.id = iVar2;
  local_28._vptr_Model = (_func_int **)&PTR_save_0013ffe0;
  Model<Mock>::save(&local_28);
  rhs = Model<Mock>::findById(local_28.id);
  testing::internal::CmpHelperEQ<Mock,Mock>
            (local_38,"object","*Mock::findById(object.getId())",(Mock *)&local_28,rhs);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ajatprabha[P]CS223_Apr18_02/tests/base_tests/ModelTests.cpp"
               ,0x2e,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ModelTestFixture, testFindById) {
    Mock object = Mock();
    object.save();
    ASSERT_EQ(object, *Mock::findById(object.getId()));
}